

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

string * cmsys::SystemTools::Capitalized(string *__return_storage_ptr__,string *s)

{
  int iVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (s->_M_string_length != 0) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)s->_M_string_length);
    iVar1 = toupper((int)*(s->_M_dataplus)._M_p);
    *(__return_storage_ptr__->_M_dataplus)._M_p = (char)iVar1;
    if (1 < s->_M_string_length) {
      uVar2 = 1;
      do {
        iVar1 = tolower((int)(s->_M_dataplus)._M_p[uVar2]);
        (__return_storage_ptr__->_M_dataplus)._M_p[uVar2] = (char)iVar1;
        uVar2 = uVar2 + 1;
      } while (uVar2 < s->_M_string_length);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemTools::Capitalized(const kwsys_stl::string& s)
{
  kwsys_stl::string n;
  if(s.empty())
    {
    return n;
    }
  n.resize(s.size());
  n[0] = static_cast<kwsys_stl::string::value_type>(toupper(s[0]));
  for (size_t i = 1; i < s.size(); i++)
    {
    n[i] = static_cast<kwsys_stl::string::value_type>(tolower(s[i]));
    }
  return n;
}